

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O0

bool __thiscall raptor::TcpServer::CloseConnection(TcpServer *this,ConnectionId cid)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_38 [8];
  shared_ptr<raptor::Connection> con;
  uint32_t index;
  ConnectionId cid_local;
  TcpServer *this_local;
  
  con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       CheckConnectionId(this,cid);
  if (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
      == 0xffffffff) {
    this_local._7_1_ = false;
  }
  else {
    GetConnection((TcpServer *)local_38,(uint32_t)this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<raptor::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_38);
      Connection::Shutdown(this_00,false);
      DeleteConnection(this,con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_);
    }
    this_local._7_1_ = true;
    std::shared_ptr<raptor::Connection>::~shared_ptr((shared_ptr<raptor::Connection> *)local_38);
  }
  return this_local._7_1_;
}

Assistant:

bool TcpServer::CloseConnection(ConnectionId cid){
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        return false;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(false);
        DeleteConnection(index);
    }
    return true;
}